

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSubSimplexConvexCast.cpp
# Opt level: O0

bool __thiscall
btSubsimplexConvexCast::calcTimeOfImpact
          (btSubsimplexConvexCast *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  long *plVar1;
  int iVar2;
  bool bVar3;
  btVector3 *pbVar4;
  btVector3 *v1;
  btTransform *in_RCX;
  btTransform *in_RDX;
  btTransform *in_RSI;
  long in_RDI;
  btTransform *in_R8;
  long in_R9;
  btScalar bVar5;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  btVector3 bVar6;
  btVector3 hitB;
  btVector3 hitA;
  btScalar VdotW;
  btScalar VdotR;
  btVector3 p;
  btVector3 w;
  btScalar epsilon;
  btScalar dist2;
  btVector3 c;
  btVector3 n;
  int maxIter;
  btVector3 supVertexB;
  btVector3 supVertexA;
  btVector3 v;
  btVector3 r;
  btTransform interpolatedTransB;
  btTransform interpolatedTransA;
  btScalar lambda;
  btVector3 linVelB;
  btVector3 linVelA;
  btTransform *in_stack_fffffffffffffc78;
  btTransform *in_stack_fffffffffffffc80;
  btMatrix3x3 *in_stack_fffffffffffffc88;
  btVoronoiSimplexSolver *in_stack_fffffffffffffc90;
  btVoronoiSimplexSolver *this_00;
  btVoronoiSimplexSolver *in_stack_fffffffffffffca0;
  btVector3 *in_stack_fffffffffffffca8;
  btTransform *in_stack_fffffffffffffcb0;
  btVector3 local_2e4;
  btVector3 local_2d4;
  btScalar local_2c4;
  btScalar local_2c0;
  btScalar local_2bc;
  btVector3 local_2b8;
  undefined8 local_2a8;
  undefined8 local_2a0;
  btScalar local_298 [2];
  btScalar local_290 [2];
  float local_288;
  btScalar local_284 [2];
  btScalar local_27c [2];
  undefined8 local_274;
  undefined8 local_26c;
  undefined8 local_264;
  undefined8 local_25c;
  btScalar local_254 [2];
  btScalar abStack_24c [2];
  undefined8 local_244;
  undefined8 local_23c;
  undefined8 local_234;
  undefined8 local_22c;
  undefined8 local_224;
  undefined8 local_21c;
  btScalar local_214 [2];
  btScalar abStack_20c [2];
  btScalar local_204;
  btVector3 local_200;
  btVector3 local_1f0;
  float local_1e0;
  float local_1dc;
  btVector3 local_1d8;
  btScalar local_1c8;
  btScalar local_1c4;
  btScalar local_1c0;
  btVector3 local_1bc;
  int local_1ac;
  btScalar local_1a8 [2];
  btScalar local_1a0 [2];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  btVector3 local_178;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  btVector3 local_138;
  btVector3 local_11c;
  btVector3 local_10c;
  btTransform local_fc;
  btTransform local_bc;
  float local_7c;
  btScalar local_78 [2];
  btScalar abStack_70 [2];
  btScalar local_68 [2];
  btScalar abStack_60 [2];
  btVector3 local_58;
  btVector3 local_48;
  long local_38;
  btTransform *local_30;
  btTransform *local_28;
  btTransform *local_20;
  btTransform *local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  btVoronoiSimplexSolver::reset(in_stack_fffffffffffffca0);
  btVector3::btVector3(&local_48);
  btVector3::btVector3(&local_58);
  btTransform::getOrigin(local_20);
  btTransform::getOrigin(local_18);
  bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
  abStack_60 = bVar6.m_floats._8_8_;
  local_68 = bVar6.m_floats._0_8_;
  local_48.m_floats._0_8_ = local_68;
  local_48.m_floats._8_8_ = abStack_60;
  btTransform::getOrigin(local_30);
  btTransform::getOrigin(local_28);
  bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
  abStack_70 = bVar6.m_floats._8_8_;
  local_78 = bVar6.m_floats._0_8_;
  local_7c = 0.0;
  local_58.m_floats._0_8_ = local_78;
  local_58.m_floats._8_8_ = abStack_70;
  btTransform::btTransform(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  btTransform::btTransform(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
  local_10c.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_10c.m_floats._0_8_ = bVar6.m_floats._0_8_;
  btVector3::btVector3(&local_11c);
  plVar1 = *(long **)(in_RDI + 0x10);
  bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc80);
  local_160 = bVar6.m_floats._8_8_;
  local_168 = bVar6.m_floats._0_8_;
  btTransform::getBasis(local_18);
  bVar6 = ::operator*((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_150 = bVar6.m_floats._8_8_;
  local_158 = bVar6.m_floats._0_8_;
  local_148 = (**(code **)(*plVar1 + 0x80))(plVar1,&local_158);
  local_140 = extraout_XMM1_Qa;
  bVar6 = btTransform::operator()(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  local_138.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_138.m_floats._0_8_ = bVar6.m_floats._0_8_;
  plVar1 = *(long **)(in_RDI + 0x18);
  btTransform::getBasis(local_28);
  bVar6 = ::operator*((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_190 = bVar6.m_floats._8_8_;
  local_198 = bVar6.m_floats._0_8_;
  local_188 = (**(code **)(*plVar1 + 0x80))(plVar1,&local_198);
  local_180 = extraout_XMM1_Qa_00;
  bVar6 = btTransform::operator()(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  local_178.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_178.m_floats._0_8_ = bVar6.m_floats._0_8_;
  bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
  local_1a0 = bVar6.m_floats._8_8_;
  local_1a8 = bVar6.m_floats._0_8_;
  local_1ac = 0x20;
  local_11c.m_floats._0_8_ = local_1a8;
  local_11c.m_floats._8_8_ = local_1a0;
  btVector3::btVector3(&local_1bc);
  local_1c0 = 0.0;
  local_1c4 = 0.0;
  local_1c8 = 0.0;
  btVector3::setValue(&local_1bc,&local_1c0,&local_1c4,&local_1c8);
  btVector3::btVector3(&local_1d8);
  local_1dc = btVector3::length2((btVector3 *)0x1ee7f8);
  local_1e0 = 0.0001;
  btVector3::btVector3(&local_1f0);
  btVector3::btVector3(&local_200);
  while( true ) {
    iVar2 = local_1ac;
    if (local_1e0 < local_1dc) {
      local_1ac = local_1ac + -1;
    }
    if (local_1dc <= local_1e0 || iVar2 == 0) break;
    this_00 = *(btVoronoiSimplexSolver **)(in_RDI + 0x10);
    pbVar4 = &local_11c;
    bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc80);
    local_23c = bVar6.m_floats._8_8_;
    local_244 = bVar6.m_floats._0_8_;
    btTransform::getBasis(&local_bc);
    bVar6 = ::operator*((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_22c = bVar6.m_floats._8_8_;
    local_234 = bVar6.m_floats._0_8_;
    local_224 = (**(code **)(*(long *)this_00 + 0x80))(this_00,&local_234);
    local_21c = extraout_XMM1_Qa_01;
    bVar6 = btTransform::operator()(in_stack_fffffffffffffcb0,pbVar4);
    abStack_20c = bVar6.m_floats._8_8_;
    local_214 = bVar6.m_floats._0_8_;
    in_stack_fffffffffffffcb0 = *(btTransform **)(in_RDI + 0x18);
    local_138.m_floats._0_8_ = local_214;
    local_138.m_floats._8_8_ = abStack_20c;
    btTransform::getBasis(&local_fc);
    bVar6 = ::operator*((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    local_26c = bVar6.m_floats._8_8_;
    local_274 = bVar6.m_floats._0_8_;
    local_264 = (**(code **)(*(long *)(in_stack_fffffffffffffcb0->m_basis).m_el[0].m_floats + 0x80))
                          (in_stack_fffffffffffffcb0,&local_274);
    local_25c = extraout_XMM1_Qa_02;
    bVar6 = btTransform::operator()(in_stack_fffffffffffffcb0,pbVar4);
    abStack_24c = bVar6.m_floats._8_8_;
    local_254 = bVar6.m_floats._0_8_;
    local_178.m_floats._0_8_ = local_254;
    local_178.m_floats._8_8_ = abStack_24c;
    bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
    local_27c = bVar6.m_floats._8_8_;
    local_284 = bVar6.m_floats._0_8_;
    local_1f0.m_floats._0_8_ = local_284;
    local_1f0.m_floats._8_8_ = local_27c;
    local_288 = btVector3::dot(&local_11c,&local_1f0);
    if (1.0 < local_7c) {
      return false;
    }
    if (0.0 < local_288) {
      local_204 = btVector3::dot(&local_11c,&local_10c);
      if (-1.4210855e-14 <= local_204) {
        return false;
      }
      local_7c = local_7c - local_288 / local_204;
      pbVar4 = btTransform::getOrigin(&local_bc);
      in_stack_fffffffffffffc80 = (btTransform *)btTransform::getOrigin(local_18);
      v1 = btTransform::getOrigin(local_20);
      btVector3::setInterpolate3(pbVar4,(btVector3 *)in_stack_fffffffffffffc80,v1,local_7c);
      in_stack_fffffffffffffc88 = (btMatrix3x3 *)btTransform::getOrigin(&local_fc);
      in_stack_fffffffffffffc90 = (btVoronoiSimplexSolver *)btTransform::getOrigin(local_28);
      pbVar4 = btTransform::getOrigin(local_30);
      btVector3::setInterpolate3
                (in_stack_fffffffffffffc88->m_el,(btVector3 *)in_stack_fffffffffffffc90,pbVar4,
                 local_7c);
      bVar6 = operator-((btVector3 *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
      local_290 = bVar6.m_floats._8_8_;
      local_298 = bVar6.m_floats._0_8_;
      local_1bc.m_floats[0] = local_11c.m_floats[0];
      local_1bc.m_floats[1] = local_11c.m_floats[1];
      local_1bc.m_floats[2] = local_11c.m_floats[2];
      local_1bc.m_floats[3] = local_11c.m_floats[3];
      local_1f0.m_floats._0_8_ = local_298;
      local_1f0.m_floats._8_8_ = local_290;
    }
    bVar3 = btVoronoiSimplexSolver::inSimplex(this_00,(btVector3 *)in_stack_fffffffffffffc90);
    if (!bVar3) {
      btVoronoiSimplexSolver::addVertex
                (*(btVoronoiSimplexSolver **)(in_RDI + 8),&local_1f0,&local_138,&local_178);
    }
    bVar3 = btVoronoiSimplexSolver::closest
                      (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el);
    if (bVar3) {
      local_1dc = btVector3::length2((btVector3 *)0x1eec53);
    }
    else {
      local_1dc = 0.0;
    }
  }
  *(float *)(local_38 + 0xa8) = local_7c;
  bVar5 = btVector3::length2((btVector3 *)0x1eec95);
  if (bVar5 < 1.4210855e-14) {
    local_2bc = 0.0;
    local_2c0 = 0.0;
    local_2c4 = 0.0;
    btVector3::btVector3(&local_2b8,&local_2bc,&local_2c0,&local_2c4);
    *(undefined8 *)(local_38 + 0x88) = local_2b8.m_floats._0_8_;
    *(undefined8 *)(local_38 + 0x90) = local_2b8.m_floats._8_8_;
  }
  else {
    bVar6 = btVector3::normalized(in_stack_fffffffffffffc88->m_el);
    local_2a0 = bVar6.m_floats._8_8_;
    local_2a8 = bVar6.m_floats._0_8_;
    *(undefined8 *)(local_38 + 0x88) = local_2a8;
    *(undefined8 *)(local_38 + 0x90) = local_2a0;
  }
  bVar5 = btVector3::dot((btVector3 *)(local_38 + 0x88),&local_10c);
  if (-*(float *)(local_38 + 0xb8) <= bVar5) {
    return false;
  }
  btVector3::btVector3(&local_2d4);
  btVector3::btVector3(&local_2e4);
  btVoronoiSimplexSolver::compute_points
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88->m_el,
             (btVector3 *)in_stack_fffffffffffffc80);
  *(undefined8 *)(local_38 + 0x98) = local_2e4.m_floats._0_8_;
  *(undefined8 *)(local_38 + 0xa0) = local_2e4.m_floats._8_8_;
  return true;
}

Assistant:

bool	btSubsimplexConvexCast::calcTimeOfImpact(
		const btTransform& fromA,
		const btTransform& toA,
		const btTransform& fromB,
		const btTransform& toB,
		CastResult& result)
{

	m_simplexSolver->reset();

	btVector3 linVelA,linVelB;
	linVelA = toA.getOrigin()-fromA.getOrigin();
	linVelB = toB.getOrigin()-fromB.getOrigin();

	btScalar lambda = btScalar(0.);

	btTransform interpolatedTransA = fromA;
	btTransform interpolatedTransB = fromB;

	///take relative motion
	btVector3 r = (linVelA-linVelB);
	btVector3 v;
	
	btVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r*fromA.getBasis()));
	btVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r*fromB.getBasis()));
	v = supVertexA-supVertexB;
	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	
	btVector3 c;

	


	btScalar dist2 = v.length2();
#ifdef BT_USE_DOUBLE_PRECISION
	btScalar epsilon = btScalar(0.0001);
#else
	btScalar epsilon = btScalar(0.0001);
#endif //BT_USE_DOUBLE_PRECISION
	btVector3	w,p;
	btScalar VdotR;
	
	while ( (dist2 > epsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v*interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v*interpolatedTransB.getBasis()));
		w = supVertexA-supVertexB;

		btScalar VdotW = v.dot(w);

		if (lambda > btScalar(1.0))
		{
			return false;
		}

		if ( VdotW > btScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON*SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(),toA.getOrigin(),lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(),toB.getOrigin(),lambda);
				//m_simplexSolver->reset();
				//check next line
				 w = supVertexA-supVertexB;
				
				n = v;
				
			}
		} 
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex( w, supVertexA , supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();
			
			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		} else
		{
			dist2 = btScalar(0.);
		} 
	}

	//int numiter = MAX_ITERATIONS - maxIter;
//	printf("number of iterations: %d", numiter);
	
	//don't report a time of impact when moving 'away' from the hitnormal
	

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON*SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = btVector3(btScalar(0.0), btScalar(0.0), btScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r)>=-result.m_allowedPenetration)
		return false;

	btVector3 hitA,hitB;
	m_simplexSolver->compute_points(hitA,hitB);
	result.m_hitPoint=hitB;
	return true;
}